

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

void ARKodeFree(void **arkode_mem)

{
  long *in_RDI;
  ARKodeMem ark_mem;
  ARKodeRelaxMem in_stack_ffffffffffffffe8;
  ARKodeMem ark_mem_00;
  
  if (*in_RDI != 0) {
    ark_mem_00 = (ARKodeMem)*in_RDI;
    if (ark_mem_00->step_free != (ARKTimestepFree)0x0) {
      (*ark_mem_00->step_free)(ark_mem_00);
    }
    arkFreeVectors((ARKodeMem)0x17e9a2);
    if (ark_mem_00->hadapt_mem != (ARKodeHAdaptMem)0x0) {
      if (ark_mem_00->hadapt_mem->owncontroller != 0) {
        SUNAdaptController_Destroy(ark_mem_00->hadapt_mem->hcontroller);
        ark_mem_00->hadapt_mem->owncontroller = 0;
      }
      free(ark_mem_00->hadapt_mem);
      ark_mem_00->hadapt_mem = (ARKodeHAdaptMem)0x0;
    }
    if (ark_mem_00->interp != (ARKInterp)0x0) {
      arkInterpFree(ark_mem_00,(ARKInterp)in_stack_ffffffffffffffe8);
      ark_mem_00->interp = (ARKInterp)0x0;
    }
    if (ark_mem_00->root_mem != (ARKodeRootMem)0x0) {
      arkRootFree(in_stack_ffffffffffffffe8);
      ark_mem_00->root_mem = (ARKodeRootMem)0x0;
    }
    if (ark_mem_00->relax_mem != (ARKodeRelaxMem)0x0) {
      arkRelaxDestroy(in_stack_ffffffffffffffe8);
      ark_mem_00->relax_mem = (ARKodeRelaxMem)0x0;
    }
    free((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void ARKodeFree(void** arkode_mem)
{
  ARKodeMem ark_mem;

  if (*arkode_mem == NULL) { return; }

  ark_mem = (ARKodeMem)(*arkode_mem);

  /* free the time-stepper module memory (if provided) */
  if (ark_mem->step_free) { ark_mem->step_free(ark_mem); }

  /* free vector storage */
  arkFreeVectors(ark_mem);

  /* free the time step adaptivity module */
  if (ark_mem->hadapt_mem != NULL)
  {
    if (ark_mem->hadapt_mem->owncontroller)
    {
      (void)SUNAdaptController_Destroy(ark_mem->hadapt_mem->hcontroller);
      ark_mem->hadapt_mem->owncontroller = SUNFALSE;
    }
    free(ark_mem->hadapt_mem);
    ark_mem->hadapt_mem = NULL;
  }

  /* free the interpolation module */
  if (ark_mem->interp != NULL)
  {
    arkInterpFree(ark_mem, ark_mem->interp);
    ark_mem->interp = NULL;
  }

  /* free the root-finding module */
  if (ark_mem->root_mem != NULL)
  {
    (void)arkRootFree(ark_mem);
    ark_mem->root_mem = NULL;
  }

  /* free the relaxation module */
  if (ark_mem->relax_mem)
  {
    (void)arkRelaxDestroy(ark_mem->relax_mem);
    ark_mem->relax_mem = NULL;
  }

  free(*arkode_mem);
  *arkode_mem = NULL;
}